

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

uint __thiscall Js::FunctionBody::GetLoopInterpretCount(FunctionBody *this,LoopHeader *loopHeader)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  uint uVar7;
  
  uVar2 = DAT_015b8ee8;
  uVar7 = this->loopInterpreterLimit;
  if (loopHeader->isNested == true) {
    bVar3 = ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Configuration::Global,LoopInterpretCountFlag);
    uVar5 = uVar2;
    if (!bVar3) {
      uVar4 = (DAT_015bbe4c ^ 1) * 9 + 0x10;
      if (uVar4 < uVar2) {
        uVar5 = uVar4;
      }
      if (uVar5 < uVar2 / 3) {
        uVar5 = uVar2 / 3;
      }
    }
    if (uVar7 < uVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1ca4,
                                  "(GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount())",
                                  "GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    uVar2 = DAT_015b8ee8;
    bVar3 = ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Configuration::Global,LoopInterpretCountFlag);
    uVar7 = uVar2;
    if (!bVar3) {
      uVar5 = (DAT_015bbe4c ^ 1) * 9 + 0x10;
      if (uVar5 < uVar2) {
        uVar7 = uVar5;
      }
      if (uVar7 < uVar2 / 3) {
        uVar7 = uVar2 / 3;
      }
    }
  }
  return uVar7;
}

Assistant:

uint FunctionBody::GetLoopInterpretCount(LoopHeader* loopHeader) const
    {
        if(loopHeader->isNested)
        {
            Assert(GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount());
            return GetReducedLoopInterpretCount();
        }
        return GetLoopInterpreterLimit();
    }